

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O2

int SHA224_256Reset(SHA256Context *context,uint32_t *H0)

{
  if (context != (SHA256Context *)0x0) {
    context->Length_Low = 0;
    context->Length_High = 0;
    context->Message_Block_Index = 0;
    context->Intermediate_Hash[0] = *H0;
    context->Intermediate_Hash[1] = H0[1];
    context->Intermediate_Hash[2] = H0[2];
    context->Intermediate_Hash[3] = H0[3];
    context->Intermediate_Hash[4] = H0[4];
    context->Intermediate_Hash[5] = H0[5];
    context->Intermediate_Hash[6] = H0[6];
    context->Intermediate_Hash[7] = H0[7];
    context->Computed = 0;
    context->Corrupted = 0;
    return 0;
  }
  return 1;
}

Assistant:

static int SHA224_256Reset(SHA256Context *context, uint32_t *H0)
{
    int result;
    if (!context)
    {
        result = shaNull;
    }
    else
    {
        context->Length_Low = 0;
        context->Length_High = 0;
        context->Message_Block_Index = 0;

        context->Intermediate_Hash[0] = H0[0];
        context->Intermediate_Hash[1] = H0[1];
        context->Intermediate_Hash[2] = H0[2];
        context->Intermediate_Hash[3] = H0[3];
        context->Intermediate_Hash[4] = H0[4];
        context->Intermediate_Hash[5] = H0[5];
        context->Intermediate_Hash[6] = H0[6];
        context->Intermediate_Hash[7] = H0[7];

        context->Computed = 0;
        context->Corrupted = 0;
        result = shaSuccess;
    }
    return result;
}